

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O0

void __thiscall
GenericSectionImport_TextBadDataType_Test::TestBody(GenericSectionImport_TextBadDataType_Test *this)

{
  bool bVar1;
  char *pcVar2;
  error_code *lhs;
  error_code eVar3;
  not_null<pstore::repo::section_content_*> in_stack_fffffffffffffc98;
  AssertHelper local_308;
  Message local_300;
  error_code local_2f8;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2b8;
  Message local_2b0;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_;
  string_mapping local_288;
  not_null<pstore::database_*> local_200;
  allocator local_1f1;
  string local_1f0 [32];
  parser<pstore::exchange::import_ns::callbacks> local_1d0;
  parser<pstore::exchange::import_ns::callbacks> *local_128;
  parser<pstore::exchange::import_ns::callbacks> *parser;
  section_content imported_content;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  local_30;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  GenericSectionImport_TextBadDataType_Test *this_local;
  
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
            *)&inserter);
  local_30 = std::
             back_inserter<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>
                       ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                         *)&inserter);
  pstore::repo::section_content::section_content((section_content *)&parser);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"{ \"align\":8, \"data\":true }",&local_1f1);
  pstore::gsl::not_null<pstore::database_*>::not_null
            (&local_200,&(this->super_GenericSectionImport).db_);
  local_288.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  local_288.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_288.lookup_._M_h._M_element_count = 0;
  local_288.lookup_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_288.lookup_._M_h._M_rehash_policy._4_4_ = 0;
  local_288.lookup_._M_h._M_bucket_count = 0;
  local_288.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_288.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  local_288.lookup_._M_h._M_buckets = (__buckets_ptr)0x0;
  local_288.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_288.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_288.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_288.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_288.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_288.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pstore::exchange::import_ns::string_mapping::string_mapping(&local_288);
  pstore::gsl::not_null<pstore::repo::section_content_*>::not_null
            ((not_null<pstore::repo::section_content_*> *)&gtest_ar_.message_,
             (section_content *)&parser);
  (anonymous_namespace)::
  parse<(pstore::repo::section_kind)0,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
            (&local_1d0,(_anonymous_namespace_ *)local_1f0,(string *)local_200.ptr_,
             (database *)&local_288,(string_mapping *)&stack0xffffffffffffffd0,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,in_stack_fffffffffffffc98);
  pstore::exchange::import_ns::string_mapping::~string_mapping(&local_288);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  local_128 = &local_1d0;
  local_2a1 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error(local_128);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2a0,(AssertionResult *)0x2ecd1e,
               "false","true",
               (char *)gtest_ar_.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0x150,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  lhs = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error(local_128);
  eVar3 = pstore::exchange::import_ns::make_error_code(unexpected_boolean);
  local_2f8._M_cat = eVar3._M_cat;
  local_2f8._M_value = eVar3._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_2e8,"parser.last_error ()",
             "make_error_code (pstore::exchange::import_ns::error::unexpected_boolean)",lhs,
             &local_2f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0x152,pcVar2);
    testing::internal::AssertHelper::operator=(&local_308,&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&local_1d0);
  pstore::repo::section_content::~section_content((section_content *)&parser);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
             *)&inserter);
  return;
}

Assistant:

TEST_F (GenericSectionImport, TextBadDataType) {
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);
    pstore::repo::section_content imported_content;

    // The data value is a boolean rather than a string.
    auto const & parser = parse<pstore::repo::section_kind::text> (
        R"({ "align":8, "data":true })", &db_, pstore::exchange::import_ns::string_mapping{},
        &inserter, &imported_content);
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
}